

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# J2CLItableMerging.cpp
# Opt level: O1

void __thiscall anon_func::Reindexer::~Reindexer(Reindexer *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->super_WalkerPass<wasm::PostWalker<Reindexer,_wasm::Visitor<Reindexer,_void>_>_>).
           super_PostWalker<Reindexer,_wasm::Visitor<Reindexer,_void>_>.
           super_Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<Reindexer,_wasm::Visitor<Reindexer,_void>_>_>
                                          ).
                                          super_PostWalker<Reindexer,_wasm::Visitor<Reindexer,_void>_>
                                          .super_Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>.
                                          stack.flexible.
                                          super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  ::wasm::Pass::~Pass((Pass *)this);
  operator_delete(this,0x138);
  return;
}

Assistant:

void updateVtableFieldsAccesses(Module& wasm) {
    struct Reindexer : public WalkerPass<PostWalker<Reindexer>> {
      bool isFunctionParallel() override { return true; }

      J2CLItableMerging& parent;

      Reindexer(J2CLItableMerging& parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Reindexer>(parent);
      }

      void visitStructGet(StructGet* curr) {
        if (curr->ref->type == Type::unreachable) {
          return;
        }

        if (!parent.structInfoByVtableType.count(
              curr->ref->type.getHeapType())) {
          return;
        }
        // This is a struct.get on the vtable.
        // It is ok to just change the index since the field has moved but
        // the type is the same.
        curr->index += parent.itableSize;
      }

      void visitStructNew(StructNew* curr) {
        if (curr->type == Type::unreachable) {
          return;
        }

        auto it = parent.structInfoByVtableType.find(curr->type.getHeapType());
        if (it == parent.structInfoByVtableType.end()) {
          return;
        }
        // The struct.new is for a vtable type and structInfo has the
        // information relating the struct types for the Java class, its vtable
        // and its itable.
        auto structInfo = it->second;

        // Get the global that holds the corresponding itable instance.
        auto* itableGlobal = parent.tableGlobalsByType[structInfo->itable];
        StructNew* itableStructNew = nullptr;

        if (itableGlobal && itableGlobal->init) {
          if (itableGlobal->init->is<GlobalGet>()) {
            // The global might get initialized with the shared empty itable,
            // obtain the itable struct.new from the global.init.
            auto* globalGet = itableGlobal->init->dynCast<GlobalGet>();
            auto* global = getModule()->getGlobal(globalGet->name);
            itableStructNew = global->init->dynCast<StructNew>();
          } else {
            // The global is initialized with a struct.new of the itable.
            itableStructNew = itableGlobal->init->dynCast<StructNew>();
          }
        }

        if (!itableStructNew) {
          Fatal() << "--merge-j2cl-itables needs to be the first pass to run "
                  << "on j2cl output. (itable initializer not found)";
        }
        auto& itableFieldInitializers = itableStructNew->operands;

        // Add the initialization for the itable fields.
        for (Index i = parent.itableSize; i > 0; i--) {
          if (itableFieldInitializers.size() >= i) {
            // The itable was initialized with a struct.new, copy the
            // initialization values.
            curr->operands.insertAt(
              0,
              ExpressionManipulator::copy(itableFieldInitializers[i - 1],
                                          *getModule()));
          } else {
            // The itable was initialized with struct.new_default. So use
            // null values to initialize the itable fields.
            Builder builder(*getModule());
            curr->operands.insertAt(
              0,
              builder.makeRefNull(itableStructNew->type.getHeapType()
                                    .getStruct()
                                    .fields[i - 1]
                                    .type.getHeapType()));
          }
        }
      }
    };

    Reindexer reindexer(*this);
    reindexer.run(getPassRunner(), &wasm);
    reindexer.runOnModuleCode(getPassRunner(), &wasm);
  }